

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O2

ExecuteResult __thiscall Statement::executeSelect(Statement *this,Table *t)

{
  Cursor *this_00;
  char *src;
  int i;
  uint uVar1;
  Row r;
  
  this_00 = Table::tableStart(t);
  for (uVar1 = 0; uVar1 < t->numRows; uVar1 = uVar1 + 1) {
    src = Cursor::value(this_00);
    Row::deserialize(&r,src);
    Row::print(&r);
    Cursor::advance(this_00);
  }
  operator_delete(this_00,0x18);
  return ExecuteSucess;
}

Assistant:

ExecuteResult Statement::executeSelect(Table *t) {
		Row r;
		Cursor *c = t->tableStart();
		for (int i = 0; i < t->rows(); ++i) {
			r.deserialize(c->value());
			r.print();
			c->advance();
		}
		delete c;
		return ExecuteSucess;
	}